

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_updated_tlm
                   (opj_j2k_t *p_j2k,opj_stream_private *p_stream,opj_event_mgr *p_manager)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  OPJ_BOOL OVar4;
  OPJ_OFF_T p_size;
  OPJ_SIZE_T OVar5;
  OPJ_UINT32 size_per_tile_part;
  OPJ_OFF_T l_current_position;
  OPJ_OFF_T l_tlm_position;
  OPJ_UINT32 l_tlm_size;
  opj_event_mgr *p_manager_local;
  opj_stream_private *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x32c4,
                  "OPJ_BOOL opj_j2k_write_updated_tlm(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  if (p_manager != (opj_event_mgr *)0x0) {
    if (p_stream != (opj_stream_private *)0x0) {
      iVar2 = 6;
      if ((p_j2k->m_specific_param).m_encoder.m_Ttlmi_is_byte != 0) {
        iVar2 = 5;
      }
      uVar3 = iVar2 * (p_j2k->m_specific_param).m_decoder.m_end_tile_x;
      lVar1 = (p_j2k->m_specific_param).m_encoder.m_tlm_start;
      p_size = opj_stream_tell(p_stream);
      OVar4 = opj_stream_seek(p_stream,lVar1 + 6,p_manager);
      if (OVar4 == 0) {
        p_j2k_local._4_4_ = 0;
      }
      else {
        OVar5 = opj_stream_write_data
                          (p_stream,(p_j2k->m_specific_param).m_encoder.m_tlm_sot_offsets_buffer,
                           (ulong)uVar3,p_manager);
        if (OVar5 == uVar3) {
          OVar4 = opj_stream_seek(p_stream,p_size,p_manager);
          if (OVar4 == 0) {
            p_j2k_local._4_4_ = 0;
          }
          else {
            p_j2k_local._4_4_ = 1;
          }
        }
        else {
          p_j2k_local._4_4_ = 0;
        }
      }
      return p_j2k_local._4_4_;
    }
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x32c6,
                  "OPJ_BOOL opj_j2k_write_updated_tlm(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
                 );
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0x32c5,
                "OPJ_BOOL opj_j2k_write_updated_tlm(opj_j2k_t *, struct opj_stream_private *, struct opj_event_mgr *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_updated_tlm(opj_j2k_t *p_j2k,
        struct opj_stream_private *p_stream,
        struct opj_event_mgr * p_manager)
{
    OPJ_UINT32 l_tlm_size;
    OPJ_OFF_T l_tlm_position, l_current_position;
    OPJ_UINT32 size_per_tile_part;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    size_per_tile_part = p_j2k->m_specific_param.m_encoder.m_Ttlmi_is_byte ? 5 : 6;
    l_tlm_size = size_per_tile_part *
                 p_j2k->m_specific_param.m_encoder.m_total_tile_parts;
    l_tlm_position = 6 + p_j2k->m_specific_param.m_encoder.m_tlm_start;
    l_current_position = opj_stream_tell(p_stream);

    if (! opj_stream_seek(p_stream, l_tlm_position, p_manager)) {
        return OPJ_FALSE;
    }

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_tlm_sot_offsets_buffer, l_tlm_size,
                              p_manager) != l_tlm_size) {
        return OPJ_FALSE;
    }

    if (! opj_stream_seek(p_stream, l_current_position, p_manager)) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}